

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

Type * __thiscall
soul::AST::EndpointDetails::getElementDataType
          (Type *__return_storage_ptr__,EndpointDetails *this,Expression *e)

{
  bool bVar1;
  uint uVar2;
  reference pTVar3;
  Type *type;
  __normal_iterator<soul::Type_*,_std::vector<soul::Type,_std::allocator<soul::Type>_>_> local_50;
  iterator __end2;
  iterator __begin2;
  vector<soul::Type,_std::allocator<soul::Type>_> *__range2;
  Expression *e_local;
  EndpointDetails *this_local;
  
  getResolvedDataTypes((vector<soul::Type,_std::allocator<soul::Type>_> *)&__begin2,this);
  __end2 = std::vector<soul::Type,_std::allocator<soul::Type>_>::begin
                     ((vector<soul::Type,_std::allocator<soul::Type>_> *)&__begin2);
  local_50._M_current =
       (Type *)std::vector<soul::Type,_std::allocator<soul::Type>_>::end
                         ((vector<soul::Type,_std::allocator<soul::Type>_> *)&__begin2);
  do {
    bVar1 = __gnu_cxx::operator!=(&__end2,&local_50);
    if (!bVar1) {
      type._4_4_ = 2;
LAB_004af389:
      std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector
                ((vector<soul::Type,_std::allocator<soul::Type>_> *)&__begin2);
      if (type._4_4_ != 1) {
        throwInternalCompilerError("getElementDataType",0x41e);
      }
      return __return_storage_ptr__;
    }
    pTVar3 = __gnu_cxx::
             __normal_iterator<soul::Type_*,_std::vector<soul::Type,_std::allocator<soul::Type>_>_>
             ::operator*(&__end2);
    uVar2 = (*(e->super_Statement).super_ASTObject._vptr_ASTObject[0x10])(e,pTVar3);
    if ((uVar2 & 1) != 0) {
      Type::Type(__return_storage_ptr__,pTVar3);
      type._4_4_ = 1;
      goto LAB_004af389;
    }
    __gnu_cxx::
    __normal_iterator<soul::Type_*,_std::vector<soul::Type,_std::allocator<soul::Type>_>_>::
    operator++(&__end2);
  } while( true );
}

Assistant:

Type getElementDataType (Expression& e) const
        {
            for (auto& type : getResolvedDataTypes())
                if (e.canSilentlyCastTo (type))
                    return type;

            SOUL_ASSERT_FALSE;
            return {};
        }